

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::Opnd::IsNotNumber(Opnd *this)

{
  bool bVar1;
  RegOpnd *pRVar2;
  RegOpnd *regOpnd;
  Opnd *local_18;
  Opnd *this_local;
  
  local_18 = this;
  regOpnd._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)GetValueType(this);
  bVar1 = ValueType::IsNotNumber((ValueType *)((long)&regOpnd + 6));
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = IsRegOpnd(this);
    if (bVar1) {
      pRVar2 = AsRegOpnd(this);
      if (pRVar2->m_sym == (StackSym *)0x0) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = (*(uint *)&pRVar2->m_sym->field_0x18 >> 1 & 1) != 0;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Opnd::IsNotNumber() const
{
    if (this->GetValueType().IsNotNumber())
    {
        return true;
    }
    if (this->IsRegOpnd())
    {
        const IR::RegOpnd* regOpnd = this->AsRegOpnd();

        if (regOpnd->m_sym == nullptr)
        {
            return true;
        }

        return regOpnd->m_sym->m_isNotNumber;
    }
    return false;
}